

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O2

pair<HighsSplitDeque::Status,_HighsTask_*> __thiscall HighsSplitDeque::pop(HighsSplitDeque *this)

{
  element_type *peVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  HighsTask *pHVar5;
  pair<HighsSplitDeque::Status,_HighsTask_*> pVar6;
  undefined8 uStack_10;
  
  uVar3 = (this->ownerData).head;
  if (uVar3 == 0) {
    return (pair<HighsSplitDeque::Status,_HighsTask_*>)ZEXT816(0);
  }
  if (0x2000 < uVar3) {
    (this->ownerData).head = uVar3 - 1;
    uStack_10 = 3;
    pHVar5 = (HighsTask *)0x0;
    goto LAB_002481d9;
  }
  if ((this->ownerData).allStolenCopy == true) {
LAB_0024816e:
    uVar3 = uVar3 - 1;
    uStack_10 = 1;
  }
  else {
    if ((this->ownerData).splitCopy == uVar3) {
      bVar2 = shrinkShared(this);
      uVar3 = (this->ownerData).head;
      if (bVar2) goto LAB_0024816e;
    }
    uVar4 = uVar3 - 1;
    (this->ownerData).head = uVar4;
    if (uVar4 == 0) {
      if ((this->ownerData).allStolenCopy == false) {
        (this->ownerData).allStolenCopy = true;
        (this->stealerData).allStolen._M_base._M_i = true;
        peVar1 = (this->ownerData).workerBunk.
                 super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        LOCK();
        (peVar1->haveJobs).super___atomic_base<int>._M_i =
             (peVar1->haveJobs).super___atomic_base<int>._M_i + -1;
        UNLOCK();
      }
    }
    else if (uVar4 != (this->ownerData).splitCopy) {
      growShared(this);
    }
    uVar3 = (this->ownerData).head;
    uStack_10 = 2;
  }
  pHVar5 = (this->taskArray)._M_elems + uVar3;
LAB_002481d9:
  pVar6.second = pHVar5;
  pVar6._0_8_ = uStack_10;
  return pVar6;
}

Assistant:

std::pair<Status, HighsTask*> pop() {
    if (ownerData.head == 0) return std::make_pair(Status::kEmpty, nullptr);

    if (ownerData.head > kTaskArraySize) {
      // task queue was full and the overflown tasks have
      // been directly executed
      ownerData.head -= 1;
      return std::make_pair(Status::kOverflown, nullptr);
    }

    if (ownerData.allStolenCopy)
      return std::make_pair(Status::kStolen, &taskArray[ownerData.head - 1]);

    if (ownerData.splitCopy == ownerData.head) {
      if (shrinkShared())
        return std::make_pair(Status::kStolen, &taskArray[ownerData.head - 1]);
    }

    ownerData.head -= 1;

    if (ownerData.head == 0) {
      if (!ownerData.allStolenCopy) {
        ownerData.allStolenCopy = true;
        stealerData.allStolen.store(true, std::memory_order_relaxed);
        ownerData.workerBunk->haveJobs.fetch_add(-1, std::memory_order_release);
      }
    } else if (ownerData.head != ownerData.splitCopy)
      growShared();

    return std::make_pair(Status::kWork, &taskArray[ownerData.head]);
  }